

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
          *x)

{
  uint uVar1;
  uint uVar2;
  FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
  *this_00;
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *pFVar3;
  double dVar4;
  int iVar5;
  double *pdVar6;
  Fad<Fad<double>_> *pFVar7;
  bool bVar8;
  void *pvVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  uint ssize;
  long lVar13;
  long lVar14;
  ulong uVar15;
  value_type local_60;
  ulong local_40;
  Fad<Fad<double>_> *local_38;
  
  this_00 = &((x->fadexpr_).left_)->fadexpr_;
  pFVar3 = (this_00->left_->fadexpr_).right_;
  uVar1 = (((this_00->left_->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  ssize = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar2) {
    ssize = uVar2;
  }
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (this_00->right_->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  uVar1 = (((x->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize <= (int)uVar1) {
    ssize = uVar1;
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (ssize != 0) {
    local_40 = (ulong)*(uint *)(this + 0x28);
    if (local_40 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
      pdVar10 = *(double **)(this + 0x30);
      bVar8 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(&((x->fadexpr_).left_)->fadexpr_);
      if ((bVar8) && ((((x->fadexpr_).right_)->dx_).num_elts != 0)) {
        if (0 < (int)ssize) {
          uVar15 = 0;
          do {
            FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            ::fastAccessDx(&local_60,&x->fadexpr_,(int)uVar15);
            *pdVar10 = local_60.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar10 + 1),&local_60.dx_);
            pdVar10[3] = local_60.defaultVal;
            Fad<double>::~Fad(&local_60);
            uVar15 = uVar15 + 1;
            pdVar10 = pdVar10 + 4;
          } while (ssize != uVar15);
        }
      }
      else if (0 < (int)ssize) {
        uVar15 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_60,&x->fadexpr_,(int)uVar15);
          *pdVar10 = local_60.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar10 + 1),&local_60.dx_);
          pdVar10[3] = local_60.defaultVal;
          Fad<double>::~Fad(&local_60);
          uVar15 = uVar15 + 1;
          pdVar10 = pdVar10 + 4;
        } while (ssize != uVar15);
      }
    }
    else {
      lVar14 = *(long *)(this + 0x30);
      bVar8 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
              ::hasFastAccess(this_00);
      if ((bVar8) && ((((x->fadexpr_).right_)->dx_).num_elts != 0)) {
        if (0 < (int)local_40) {
          uVar15 = 0;
          do {
            FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            ::fastAccessDx(&local_60,&x->fadexpr_,(int)uVar15);
            pdVar6 = local_60.dx_.ptr_to_data;
            iVar5 = local_60.dx_.num_elts;
            pdVar10 = (double *)(uVar15 * 0x20 + lVar14);
            lVar13 = (long)local_60.dx_.num_elts;
            if (lVar13 != 0) {
              uVar1 = *(uint *)(lVar14 + 8 + uVar15 * 0x20);
              if ((ulong)uVar1 == 0) {
                *(int *)(pdVar10 + 1) = local_60.dx_.num_elts;
                uVar12 = lVar13 * 8;
                if (local_60.dx_.num_elts < 0) {
                  uVar12 = 0xffffffffffffffff;
                }
                pvVar9 = operator_new__(uVar12);
                pdVar10[2] = (double)pvVar9;
                if (0 < iVar5) {
                  lVar11 = 0;
                  do {
                    *(double *)((long)pvVar9 + lVar11 * 8) = pdVar6[lVar11];
                    lVar11 = lVar11 + 1;
                  } while (lVar13 != lVar11);
                }
              }
              else if (0 < (int)uVar1) {
                dVar4 = pdVar10[2];
                uVar12 = 0;
                do {
                  *(double *)((long)dVar4 + uVar12 * 8) =
                       local_60.dx_.ptr_to_data[uVar12] + *(double *)((long)dVar4 + uVar12 * 8);
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
            }
            *pdVar10 = local_60.val_ + *pdVar10;
            Fad<double>::~Fad(&local_60);
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_40);
        }
      }
      else if (0 < (int)local_40) {
        uVar15 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
          ::dx(&local_60,&x->fadexpr_,(int)uVar15);
          pdVar6 = local_60.dx_.ptr_to_data;
          iVar5 = local_60.dx_.num_elts;
          pdVar10 = (double *)(uVar15 * 0x20 + lVar14);
          lVar13 = (long)local_60.dx_.num_elts;
          if (lVar13 != 0) {
            uVar1 = *(uint *)(lVar14 + 8 + uVar15 * 0x20);
            if ((ulong)uVar1 == 0) {
              *(int *)(pdVar10 + 1) = local_60.dx_.num_elts;
              uVar12 = lVar13 * 8;
              if (local_60.dx_.num_elts < 0) {
                uVar12 = 0xffffffffffffffff;
              }
              pvVar9 = operator_new__(uVar12);
              pdVar10[2] = (double)pvVar9;
              if (0 < iVar5) {
                lVar11 = 0;
                do {
                  *(double *)((long)pvVar9 + lVar11 * 8) = pdVar6[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar13 != lVar11);
              }
            }
            else if (0 < (int)uVar1) {
              dVar4 = pdVar10[2];
              uVar12 = 0;
              do {
                *(double *)((long)dVar4 + uVar12 * 8) =
                     local_60.dx_.ptr_to_data[uVar12] + *(double *)((long)dVar4 + uVar12 * 8);
                uVar12 = uVar12 + 1;
              } while (uVar1 != uVar12);
            }
          }
          *pdVar10 = local_60.val_ + *pdVar10;
          Fad<double>::~Fad(&local_60);
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_40);
      }
    }
  }
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_60,&x->fadexpr_);
  pFVar7 = local_38;
  lVar14 = (long)local_60.dx_.num_elts;
  if (lVar14 != 0) {
    uVar1 = (local_38->val_).dx_.num_elts;
    if ((ulong)uVar1 == 0) {
      (local_38->val_).dx_.num_elts = local_60.dx_.num_elts;
      uVar15 = 0xffffffffffffffff;
      if (-1 < local_60.dx_.num_elts) {
        uVar15 = lVar14 * 8;
      }
      pdVar10 = (double *)operator_new__(uVar15);
      (pFVar7->val_).dx_.ptr_to_data = pdVar10;
      if (0 < local_60.dx_.num_elts) {
        lVar13 = 0;
        do {
          pdVar10[lVar13] = local_60.dx_.ptr_to_data[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar10 = (local_38->val_).dx_.ptr_to_data;
      uVar15 = 0;
      do {
        pdVar10[uVar15] = local_60.dx_.ptr_to_data[uVar15] + pdVar10[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar1 != uVar15);
    }
  }
  (pFVar7->val_).val_ = local_60.val_ + (pFVar7->val_).val_;
  Fad<double>::~Fad(&local_60);
  return pFVar7;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}